

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QList<QWidgetItemData>_>::moveAppend
          (QGenericArrayOps<QList<QWidgetItemData>_> *this,QList<QWidgetItemData> *b,
          QList<QWidgetItemData> *e)

{
  qsizetype *pqVar1;
  QList<QWidgetItemData> *pQVar2;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QList<QWidgetItemData>_>).ptr;
    for (; b < e; b = (QList<QWidgetItemData> *)(&b->d + 1)) {
      QArrayDataPointer<QWidgetItemData>::QArrayDataPointer
                (&pQVar2[(this->super_QArrayDataPointer<QList<QWidgetItemData>_>).size].d,&b->d);
      pqVar1 = &(this->super_QArrayDataPointer<QList<QWidgetItemData>_>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }